

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O1

void __thiscall
ModbusSimulationDataGenerator::SendReadWriteMultipleRegisters
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U16 ReadStartingAddress,
          U16 QuantityToRead,U16 WriteStartingAddress,U16 QuantityToWrite,U8 WriteByteCount,
          U16 *Values)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar5;
  ModbusSimulationDataGenerator *pMVar6;
  ModbusSimulationDataGenerator *this_00;
  U64 value;
  ulong uVar7;
  int iVar4;
  
  if (this->mSettings->mModbusMode == ModbusRTUClient) {
    CreateModbusByte(this,(ulong)DeviceID);
    uVar5 = (int)this + 0x30;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x17);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(ReadStartingAddress & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(ReadStartingAddress >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(QuantityToRead & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(QuantityToRead >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(WriteStartingAddress & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(WriteStartingAddress >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(QuantityToWrite & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)(QuantityToWrite >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,(ulong)WriteByteCount);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    if (1 < WriteByteCount) {
      uVar7 = 0;
      do {
        CreateModbusByte(this,(ulong)(byte)Values[uVar7]);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        SimulationChannelDescriptor::Advance(uVar5);
        CreateModbusByte(this,(ulong)*(byte *)((long)Values + uVar7 * 2 + 1));
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        SimulationChannelDescriptor::Advance(uVar5);
        uVar7 = uVar7 + 1;
      } while (WriteByteCount >> 1 != uVar7);
    }
    uVar3 = this->crc_tab16
            [(uint)(QuantityToWrite >> 8) ^
             (ushort)(this->crc_tab16
                      [(uint)(WriteStartingAddress >> 8) ^
                       (ushort)(this->crc_tab16
                                [(uint)(QuantityToRead >> 8) ^
                                 (ushort)(this->crc_tab16
                                          [(uint)(ReadStartingAddress >> 8) ^
                                           (ushort)(this->crc_tab16
                                                    [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8]
                                                    >> 8 ^ this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff]) & 0xff] >> 8 ^
                                         this->crc_tab16
                                         [(ushort)(QuantityToRead ^
                                                   this->crc_tab16
                                                   [(ushort)(ReadStartingAddress ^
                                                             this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                            this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8]) & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(ReadStartingAddress >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8] >> 8 ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff]) & 0xff]) & 0xff]) &
                                 0xff] >> 8 ^
                               this->crc_tab16
                               [(ushort)(WriteStartingAddress ^
                                         this->crc_tab16
                                         [(ushort)(QuantityToRead ^
                                                   this->crc_tab16
                                                   [(ushort)(ReadStartingAddress ^
                                                             this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                            this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8]) & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(ReadStartingAddress >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8] >> 8 ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff]) & 0xff]) & 0xff] >>
                                         8 ^ this->crc_tab16
                                             [(uint)(QuantityToRead >> 8) ^
                                              (ushort)(this->crc_tab16
                                                       [(uint)(ReadStartingAddress >> 8) ^
                                                        (ushort)(this->crc_tab16
                                                                 [this->crc_tab16[(byte)~DeviceID] &
                                                                  0xff ^ 0xe8] >> 8 ^
                                                                this->crc_tab16
                                                                [(ushort)(ReadStartingAddress ^
                                                                          this->crc_tab16
                                                                          [(byte)~DeviceID] >> 8 ^
                                                                         this->crc_tab16
                                                                         [this->crc_tab16
                                                                          [(byte)~DeviceID] & 0xff ^
                                                                          0xe8]) & 0xff]) & 0xff] >>
                                                       8 ^ this->crc_tab16
                                                           [(ushort)(QuantityToRead ^
                                                                     this->crc_tab16
                                                                     [(ushort)(ReadStartingAddress ^
                                                                               this->crc_tab16
                                                                               [(byte)~DeviceID] >>
                                                                               8 ^ this->crc_tab16
                                                                                   [this->crc_tab16
                                                                                    [(byte)~DeviceID
                                                                                    ] & 0xff ^ 0xe8]
                                                                              ) & 0xff] >> 8 ^
                                                                    this->crc_tab16
                                                                    [(uint)(ReadStartingAddress >> 8
                                                                           ) ^ (ushort)(this->
                                                  crc_tab16[this->crc_tab16[(byte)~DeviceID] & 0xff
                                                            ^ 0xe8] >> 8 ^
                                                  this->crc_tab16
                                                  [(ushort)(ReadStartingAddress ^
                                                            this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                           this->crc_tab16
                                                           [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                            ^ 0xe8]) & 0xff]) & 0xff]) & 0xff]) &
                                              0xff]) & 0xff]) & 0xff] >> 8 ^
                     this->crc_tab16
                     [(ushort)(QuantityToWrite ^
                               this->crc_tab16
                               [(ushort)(WriteStartingAddress ^
                                         this->crc_tab16
                                         [(ushort)(QuantityToRead ^
                                                   this->crc_tab16
                                                   [(ushort)(ReadStartingAddress ^
                                                             this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                            this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8]) & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(ReadStartingAddress >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8] >> 8 ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff]) & 0xff]) & 0xff] >>
                                         8 ^ this->crc_tab16
                                             [(uint)(QuantityToRead >> 8) ^
                                              (ushort)(this->crc_tab16
                                                       [(uint)(ReadStartingAddress >> 8) ^
                                                        (ushort)(this->crc_tab16
                                                                 [this->crc_tab16[(byte)~DeviceID] &
                                                                  0xff ^ 0xe8] >> 8 ^
                                                                this->crc_tab16
                                                                [(ushort)(ReadStartingAddress ^
                                                                          this->crc_tab16
                                                                          [(byte)~DeviceID] >> 8 ^
                                                                         this->crc_tab16
                                                                         [this->crc_tab16
                                                                          [(byte)~DeviceID] & 0xff ^
                                                                          0xe8]) & 0xff]) & 0xff] >>
                                                       8 ^ this->crc_tab16
                                                           [(ushort)(QuantityToRead ^
                                                                     this->crc_tab16
                                                                     [(ushort)(ReadStartingAddress ^
                                                                               this->crc_tab16
                                                                               [(byte)~DeviceID] >>
                                                                               8 ^ this->crc_tab16
                                                                                   [this->crc_tab16
                                                                                    [(byte)~DeviceID
                                                                                    ] & 0xff ^ 0xe8]
                                                                              ) & 0xff] >> 8 ^
                                                                    this->crc_tab16
                                                                    [(uint)(ReadStartingAddress >> 8
                                                                           ) ^ (ushort)(this->
                                                  crc_tab16[this->crc_tab16[(byte)~DeviceID] & 0xff
                                                            ^ 0xe8] >> 8 ^
                                                  this->crc_tab16
                                                  [(ushort)(ReadStartingAddress ^
                                                            this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                           this->crc_tab16
                                                           [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                            ^ 0xe8]) & 0xff]) & 0xff]) & 0xff]) &
                                              0xff]) & 0xff] >> 8 ^
                              this->crc_tab16
                              [(uint)(WriteStartingAddress >> 8) ^
                               (ushort)(this->crc_tab16
                                        [(uint)(QuantityToRead >> 8) ^
                                         (ushort)(this->crc_tab16
                                                  [(uint)(ReadStartingAddress >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8] >> 8 ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff]) & 0xff] >> 8 ^
                                                 this->crc_tab16
                                                 [(ushort)(QuantityToRead ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff] >> 8 ^
                                                          this->crc_tab16
                                                          [(uint)(ReadStartingAddress >> 8) ^
                                                           (ushort)(this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ] >> 8 ^ this->crc_tab16
                                                                             [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff]) & 0xff]) & 0xff]) & 0xff] >> 8 ^
                                       this->crc_tab16
                                       [(ushort)(WriteStartingAddress ^
                                                 this->crc_tab16
                                                 [(ushort)(QuantityToRead ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff] >> 8 ^
                                                          this->crc_tab16
                                                          [(uint)(ReadStartingAddress >> 8) ^
                                                           (ushort)(this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ] >> 8 ^ this->crc_tab16
                                                                             [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff]) & 0xff]) & 0xff] >> 8 ^
                                                this->crc_tab16
                                                [(uint)(QuantityToRead >> 8) ^
                                                 (ushort)(this->crc_tab16
                                                          [(uint)(ReadStartingAddress >> 8) ^
                                                           (ushort)(this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ] >> 8 ^ this->crc_tab16
                                                                             [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff]) & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(ushort)(QuantityToRead ^
                                                            this->crc_tab16
                                                            [(ushort)(ReadStartingAddress ^
                                                                      this->crc_tab16
                                                                      [(byte)~DeviceID] >> 8 ^
                                                                     this->crc_tab16
                                                                     [this->crc_tab16
                                                                      [(byte)~DeviceID] & 0xff ^
                                                                      0xe8]) & 0xff] >> 8 ^
                                                           this->crc_tab16
                                                           [(uint)(ReadStartingAddress >> 8) ^
                                                            (ushort)(this->crc_tab16
                                                                     [this->crc_tab16
                                                                      [(byte)~DeviceID] & 0xff ^
                                                                      0xe8] >> 8 ^
                                                                    this->crc_tab16
                                                                    [(ushort)(ReadStartingAddress ^
                                                                              this->crc_tab16
                                                                              [(byte)~DeviceID] >> 8
                                                                             ^ this->crc_tab16
                                                                               [this->crc_tab16
                                                                                [(byte)~DeviceID] &
                                                                                0xff ^ 0xe8]) & 0xff
                                                                    ]) & 0xff]) & 0xff]) & 0xff]) &
                                        0xff]) & 0xff]) & 0xff]) & 0xff] >> 8 ^
            this->crc_tab16
            [(byte)((byte)(this->crc_tab16
                           [(ushort)(QuantityToWrite ^
                                     this->crc_tab16
                                     [(ushort)(WriteStartingAddress ^
                                               this->crc_tab16
                                               [(ushort)(QuantityToRead ^
                                                         this->crc_tab16
                                                         [(ushort)(ReadStartingAddress ^
                                                                   this->crc_tab16[(byte)~DeviceID]
                                                                   >> 8 ^ this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8]) & 0xff] >> 8 ^
                                                        this->crc_tab16
                                                        [(uint)(ReadStartingAddress >> 8) ^
                                                         (ushort)(this->crc_tab16
                                                                  [this->crc_tab16[(byte)~DeviceID]
                                                                   & 0xff ^ 0xe8] >> 8 ^
                                                                 this->crc_tab16
                                                                 [(ushort)(ReadStartingAddress ^
                                                                           this->crc_tab16
                                                                           [(byte)~DeviceID] >> 8 ^
                                                                          this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8]) & 0xff]) & 0xff]
                                                        ) & 0xff] >> 8 ^
                                              this->crc_tab16
                                              [(uint)(QuantityToRead >> 8) ^
                                               (ushort)(this->crc_tab16
                                                        [(uint)(ReadStartingAddress >> 8) ^
                                                         (ushort)(this->crc_tab16
                                                                  [this->crc_tab16[(byte)~DeviceID]
                                                                   & 0xff ^ 0xe8] >> 8 ^
                                                                 this->crc_tab16
                                                                 [(ushort)(ReadStartingAddress ^
                                                                           this->crc_tab16
                                                                           [(byte)~DeviceID] >> 8 ^
                                                                          this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8]) & 0xff]) & 0xff]
                                                        >> 8 ^ this->crc_tab16
                                                               [(ushort)(QuantityToRead ^
                                                                         this->crc_tab16
                                                                         [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(ReadStartingAddress >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8] >> 8 ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff]) & 0xff]) & 0xff]) &
                                               0xff]) & 0xff] >> 8 ^
                                    this->crc_tab16
                                    [(uint)(WriteStartingAddress >> 8) ^
                                     (ushort)(this->crc_tab16
                                              [(uint)(QuantityToRead >> 8) ^
                                               (ushort)(this->crc_tab16
                                                        [(uint)(ReadStartingAddress >> 8) ^
                                                         (ushort)(this->crc_tab16
                                                                  [this->crc_tab16[(byte)~DeviceID]
                                                                   & 0xff ^ 0xe8] >> 8 ^
                                                                 this->crc_tab16
                                                                 [(ushort)(ReadStartingAddress ^
                                                                           this->crc_tab16
                                                                           [(byte)~DeviceID] >> 8 ^
                                                                          this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8]) & 0xff]) & 0xff]
                                                        >> 8 ^ this->crc_tab16
                                                               [(ushort)(QuantityToRead ^
                                                                         this->crc_tab16
                                                                         [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(ReadStartingAddress >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8] >> 8 ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff]) & 0xff]) & 0xff]) &
                                               0xff] >> 8 ^
                                             this->crc_tab16
                                             [(ushort)(WriteStartingAddress ^
                                                       this->crc_tab16
                                                       [(ushort)(QuantityToRead ^
                                                                 this->crc_tab16
                                                                 [(ushort)(ReadStartingAddress ^
                                                                           this->crc_tab16
                                                                           [(byte)~DeviceID] >> 8 ^
                                                                          this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8]) & 0xff] >> 8 ^
                                                                this->crc_tab16
                                                                [(uint)(ReadStartingAddress >> 8) ^
                                                                 (ushort)(this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8] >> 8 ^
                                                                         this->crc_tab16
                                                                         [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff]) & 0xff]) & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(QuantityToRead >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [(uint)(ReadStartingAddress >> 8) ^
                                                             (ushort)(this->crc_tab16
                                                                      [this->crc_tab16
                                                                       [(byte)~DeviceID] & 0xff ^
                                                                       0xe8] >> 8 ^
                                                                     this->crc_tab16
                                                                     [(ushort)(ReadStartingAddress ^
                                                                               this->crc_tab16
                                                                               [(byte)~DeviceID] >>
                                                                               8 ^ this->crc_tab16
                                                                                   [this->crc_tab16
                                                                                    [(byte)~DeviceID
                                                                                    ] & 0xff ^ 0xe8]
                                                                              ) & 0xff]) & 0xff] >>
                                                            8 ^ this->crc_tab16
                                                                [(ushort)(QuantityToRead ^
                                                                          this->crc_tab16
                                                                          [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(ReadStartingAddress >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8] >> 8 ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff]) & 0xff]) & 0xff]) &
                                                  0xff]) & 0xff]) & 0xff]) & 0xff] >> 8) ^
                    (byte)this->crc_tab16
                          [(uint)(QuantityToWrite >> 8) ^
                           (ushort)(this->crc_tab16
                                    [(uint)(WriteStartingAddress >> 8) ^
                                     (ushort)(this->crc_tab16
                                              [(uint)(QuantityToRead >> 8) ^
                                               (ushort)(this->crc_tab16
                                                        [(uint)(ReadStartingAddress >> 8) ^
                                                         (ushort)(this->crc_tab16
                                                                  [this->crc_tab16[(byte)~DeviceID]
                                                                   & 0xff ^ 0xe8] >> 8 ^
                                                                 this->crc_tab16
                                                                 [(ushort)(ReadStartingAddress ^
                                                                           this->crc_tab16
                                                                           [(byte)~DeviceID] >> 8 ^
                                                                          this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8]) & 0xff]) & 0xff]
                                                        >> 8 ^ this->crc_tab16
                                                               [(ushort)(QuantityToRead ^
                                                                         this->crc_tab16
                                                                         [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(ReadStartingAddress >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8] >> 8 ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff]) & 0xff]) & 0xff]) &
                                               0xff] >> 8 ^
                                             this->crc_tab16
                                             [(ushort)(WriteStartingAddress ^
                                                       this->crc_tab16
                                                       [(ushort)(QuantityToRead ^
                                                                 this->crc_tab16
                                                                 [(ushort)(ReadStartingAddress ^
                                                                           this->crc_tab16
                                                                           [(byte)~DeviceID] >> 8 ^
                                                                          this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8]) & 0xff] >> 8 ^
                                                                this->crc_tab16
                                                                [(uint)(ReadStartingAddress >> 8) ^
                                                                 (ushort)(this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8] >> 8 ^
                                                                         this->crc_tab16
                                                                         [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff]) & 0xff]) & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(QuantityToRead >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [(uint)(ReadStartingAddress >> 8) ^
                                                             (ushort)(this->crc_tab16
                                                                      [this->crc_tab16
                                                                       [(byte)~DeviceID] & 0xff ^
                                                                       0xe8] >> 8 ^
                                                                     this->crc_tab16
                                                                     [(ushort)(ReadStartingAddress ^
                                                                               this->crc_tab16
                                                                               [(byte)~DeviceID] >>
                                                                               8 ^ this->crc_tab16
                                                                                   [this->crc_tab16
                                                                                    [(byte)~DeviceID
                                                                                    ] & 0xff ^ 0xe8]
                                                                              ) & 0xff]) & 0xff] >>
                                                            8 ^ this->crc_tab16
                                                                [(ushort)(QuantityToRead ^
                                                                          this->crc_tab16
                                                                          [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(ReadStartingAddress >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8] >> 8 ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff]) & 0xff]) & 0xff]) &
                                                  0xff]) & 0xff]) & 0xff] >> 8 ^
                                   this->crc_tab16
                                   [(ushort)(QuantityToWrite ^
                                             this->crc_tab16
                                             [(ushort)(WriteStartingAddress ^
                                                       this->crc_tab16
                                                       [(ushort)(QuantityToRead ^
                                                                 this->crc_tab16
                                                                 [(ushort)(ReadStartingAddress ^
                                                                           this->crc_tab16
                                                                           [(byte)~DeviceID] >> 8 ^
                                                                          this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8]) & 0xff] >> 8 ^
                                                                this->crc_tab16
                                                                [(uint)(ReadStartingAddress >> 8) ^
                                                                 (ushort)(this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8] >> 8 ^
                                                                         this->crc_tab16
                                                                         [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff]) & 0xff]) & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(QuantityToRead >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [(uint)(ReadStartingAddress >> 8) ^
                                                             (ushort)(this->crc_tab16
                                                                      [this->crc_tab16
                                                                       [(byte)~DeviceID] & 0xff ^
                                                                       0xe8] >> 8 ^
                                                                     this->crc_tab16
                                                                     [(ushort)(ReadStartingAddress ^
                                                                               this->crc_tab16
                                                                               [(byte)~DeviceID] >>
                                                                               8 ^ this->crc_tab16
                                                                                   [this->crc_tab16
                                                                                    [(byte)~DeviceID
                                                                                    ] & 0xff ^ 0xe8]
                                                                              ) & 0xff]) & 0xff] >>
                                                            8 ^ this->crc_tab16
                                                                [(ushort)(QuantityToRead ^
                                                                          this->crc_tab16
                                                                          [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(ReadStartingAddress >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8] >> 8 ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff]) & 0xff]) & 0xff]) &
                                                  0xff]) & 0xff] >> 8 ^
                                            this->crc_tab16
                                            [(uint)(WriteStartingAddress >> 8) ^
                                             (ushort)(this->crc_tab16
                                                      [(uint)(QuantityToRead >> 8) ^
                                                       (ushort)(this->crc_tab16
                                                                [(uint)(ReadStartingAddress >> 8) ^
                                                                 (ushort)(this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8] >> 8 ^
                                                                         this->crc_tab16
                                                                         [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff]) & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(ushort)(QuantityToRead ^
                                                            this->crc_tab16
                                                            [(ushort)(ReadStartingAddress ^
                                                                      this->crc_tab16
                                                                      [(byte)~DeviceID] >> 8 ^
                                                                     this->crc_tab16
                                                                     [this->crc_tab16
                                                                      [(byte)~DeviceID] & 0xff ^
                                                                      0xe8]) & 0xff] >> 8 ^
                                                           this->crc_tab16
                                                           [(uint)(ReadStartingAddress >> 8) ^
                                                            (ushort)(this->crc_tab16
                                                                     [this->crc_tab16
                                                                      [(byte)~DeviceID] & 0xff ^
                                                                      0xe8] >> 8 ^
                                                                    this->crc_tab16
                                                                    [(ushort)(ReadStartingAddress ^
                                                                              this->crc_tab16
                                                                              [(byte)~DeviceID] >> 8
                                                                             ^ this->crc_tab16
                                                                               [this->crc_tab16
                                                                                [(byte)~DeviceID] &
                                                                                0xff ^ 0xe8]) & 0xff
                                                                    ]) & 0xff]) & 0xff]) & 0xff] >>
                                                  8 ^ this->crc_tab16
                                                      [(ushort)(WriteStartingAddress ^
                                                                this->crc_tab16
                                                                [(ushort)(QuantityToRead ^
                                                                          this->crc_tab16
                                                                          [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(uint)(ReadStartingAddress >> 8) ^
                                                   (ushort)(this->crc_tab16
                                                            [this->crc_tab16[(byte)~DeviceID] & 0xff
                                                             ^ 0xe8] >> 8 ^
                                                           this->crc_tab16
                                                           [(ushort)(ReadStartingAddress ^
                                                                     this->crc_tab16
                                                                     [(byte)~DeviceID] >> 8 ^
                                                                    this->crc_tab16
                                                                    [this->crc_tab16
                                                                     [(byte)~DeviceID] & 0xff ^ 0xe8
                                                                    ]) & 0xff]) & 0xff]) & 0xff] >>
                                                  8 ^ this->crc_tab16
                                                      [(uint)(QuantityToRead >> 8) ^
                                                       (ushort)(this->crc_tab16
                                                                [(uint)(ReadStartingAddress >> 8) ^
                                                                 (ushort)(this->crc_tab16
                                                                          [this->crc_tab16
                                                                           [(byte)~DeviceID] & 0xff
                                                                           ^ 0xe8] >> 8 ^
                                                                         this->crc_tab16
                                                                         [(ushort)(
                                                  ReadStartingAddress ^
                                                  this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                  this->crc_tab16
                                                  [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xe8])
                                                  & 0xff]) & 0xff] >> 8 ^
                                                  this->crc_tab16
                                                  [(ushort)(QuantityToRead ^
                                                            this->crc_tab16
                                                            [(ushort)(ReadStartingAddress ^
                                                                      this->crc_tab16
                                                                      [(byte)~DeviceID] >> 8 ^
                                                                     this->crc_tab16
                                                                     [this->crc_tab16
                                                                      [(byte)~DeviceID] & 0xff ^
                                                                      0xe8]) & 0xff] >> 8 ^
                                                           this->crc_tab16
                                                           [(uint)(ReadStartingAddress >> 8) ^
                                                            (ushort)(this->crc_tab16
                                                                     [this->crc_tab16
                                                                      [(byte)~DeviceID] & 0xff ^
                                                                      0xe8] >> 8 ^
                                                                    this->crc_tab16
                                                                    [(ushort)(ReadStartingAddress ^
                                                                              this->crc_tab16
                                                                              [(byte)~DeviceID] >> 8
                                                                             ^ this->crc_tab16
                                                                               [this->crc_tab16
                                                                                [(byte)~DeviceID] &
                                                                                0xff ^ 0xe8]) & 0xff
                                                                    ]) & 0xff]) & 0xff]) & 0xff]) &
                                                  0xff]) & 0xff]) & 0xff]) & 0xff] ^ WriteByteCount)
            ];
    if (1 < WriteByteCount) {
      uVar7 = 0;
      do {
        uVar3 = this->crc_tab16[(uVar3 ^ Values[uVar7]) & 0xff] >> 8 ^
                this->crc_tab16
                [(ushort)((uVar3 ^ Values[uVar7]) >> 8 ^
                         this->crc_tab16[(uVar3 ^ Values[uVar7]) & 0xff]) & 0xff];
        uVar7 = uVar7 + 1;
      } while (WriteByteCount >> 1 != uVar7);
    }
    CreateModbusByte(this,(ulong)uVar3 & 0xff);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = (U64)(uVar3 >> 8);
  }
  else {
    iVar4 = (uint)DeviceID + (uint)ReadStartingAddress + (uint)(ReadStartingAddress >> 8) +
            (uint)QuantityToRead + (uint)(QuantityToRead >> 8) +
            (uint)(WriteStartingAddress >> 8) + (uint)WriteStartingAddress + (uint)QuantityToWrite +
            (uint)(QuantityToWrite >> 8) + (uint)WriteByteCount + 0x17;
    cVar1 = (char)iVar4;
    if (1 < WriteByteCount) {
      uVar7 = 0;
      do {
        iVar4 = (uint)(Values[uVar7] >> 8) + iVar4 + (uint)Values[uVar7];
        cVar1 = (char)iVar4;
        uVar7 = uVar7 + 1;
      } while (WriteByteCount >> 1 != uVar7);
    }
    CreateModbusByte(this,0x3a);
    this_00 = (ModbusSimulationDataGenerator *)&this->mModbusSimulationData;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    uVar5 = (uint)this_00;
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,DeviceID >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,DeviceID & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x31);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x37);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)(ReadStartingAddress >> 0xc));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)((ReadStartingAddress & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)ReadStartingAddress >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)(ReadStartingAddress & 0xf0f));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)(QuantityToRead >> 0xc));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)((QuantityToRead & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)QuantityToRead >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)(QuantityToRead & 0xf0f));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)(WriteStartingAddress >> 0xc));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)((WriteStartingAddress & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)WriteStartingAddress >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)(WriteStartingAddress & 0xf0f));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)(QuantityToWrite >> 0xc));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)((QuantityToWrite & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(byte)QuantityToWrite >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,(U8)(QuantityToWrite & 0xf0f));
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,WriteByteCount >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(pMVar6,WriteByteCount & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar6 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    if (1 < WriteByteCount) {
      uVar7 = 0;
      do {
        bVar2 = BinToLATIN1(pMVar6,(byte)(Values[uVar7] >> 0xc));
        CreateModbusByte(this,(ulong)bVar2);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar6 = this_00;
        SimulationChannelDescriptor::Advance(uVar5);
        bVar2 = BinToLATIN1(pMVar6,*(byte *)((long)Values + uVar7 * 2 + 1) & 0xf);
        CreateModbusByte(this,(ulong)bVar2);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar6 = this_00;
        SimulationChannelDescriptor::Advance(uVar5);
        bVar2 = BinToLATIN1(pMVar6,(byte)Values[uVar7] >> 4);
        CreateModbusByte(this,(ulong)bVar2);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar6 = this_00;
        SimulationChannelDescriptor::Advance(uVar5);
        bVar2 = BinToLATIN1(pMVar6,(byte)Values[uVar7] & 0xf);
        CreateModbusByte(this,(ulong)bVar2);
        ClockGenerator::AdvanceByHalfPeriod(10.0);
        pMVar6 = this_00;
        SimulationChannelDescriptor::Advance(uVar5);
        uVar7 = uVar7 + 1;
      } while (WriteByteCount >> 1 != uVar7);
    }
    bVar2 = BinToLATIN1(pMVar6,(byte)-cVar1 >> 4);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    bVar2 = BinToLATIN1(this_00,-cVar1 & 0xf);
    CreateModbusByte(this,(ulong)bVar2);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = 10;
  }
  CreateModbusByte(this,value);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance((int)this + 0x30);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendReadWriteMultipleRegisters( U8 DeviceID, U16 ReadStartingAddress, U16 QuantityToRead,
                                                                    U16 WriteStartingAddress, U16 QuantityToWrite, U8 WriteByteCount,
                                                                    U16 Values[] )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( 0x17 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ReadStartingAddress & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ReadStartingAddress & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( QuantityToRead & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( QuantityToRead & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( WriteStartingAddress & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( WriteStartingAddress & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( QuantityToWrite & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( QuantityToWrite & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( WriteByteCount );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        for( int i = 0; i < WriteByteCount / 2; i++ )
        {
            CreateModbusByte( Values[ i ] & 0x00FF );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

            CreateModbusByte( ( Values[ i ] & 0xFF00 ) >> 8 );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
        }

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, 0x17 );
        CRCValue = update_CRC( CRCValue, ReadStartingAddress & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( ReadStartingAddress & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, QuantityToRead & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( QuantityToRead & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, WriteStartingAddress & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( WriteStartingAddress & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, QuantityToWrite & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( QuantityToWrite & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, WriteByteCount );

        for( int i = 0; i < WriteByteCount / 2; i++ )
        {
            CRCValue = update_CRC( CRCValue, Values[ i ] & 0x00FF );
            CRCValue = update_CRC( CRCValue, ( Values[ i ] & 0xFF00 ) >> 8 );
        }

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + 0x17;
        LRCvalue = LRCvalue + ( ReadStartingAddress & 0x00FF );
        LRCvalue = LRCvalue + ( ( ReadStartingAddress & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + ( QuantityToRead & 0x00FF );
        LRCvalue = LRCvalue + ( ( QuantityToRead & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + ( WriteStartingAddress & 0x00FF );
        LRCvalue = LRCvalue + ( ( WriteStartingAddress & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + ( QuantityToWrite & 0x00FF );
        LRCvalue = LRCvalue + ( ( QuantityToWrite & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + WriteByteCount;

        for( int i = 0; i < WriteByteCount / 2; i++ )
        {
            LRCvalue = LRCvalue + Values[ i ] & 0x00FF;
            LRCvalue = LRCvalue + ( ( Values[ i ] & 0xFF00 ) >> 8 );
        }

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '1' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '7' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ReadStartingAddress & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( ReadStartingAddress & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( ReadStartingAddress & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ReadStartingAddress & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( QuantityToRead & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( QuantityToRead & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( QuantityToRead & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( QuantityToRead & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( WriteStartingAddress & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( WriteStartingAddress & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( WriteStartingAddress & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( WriteStartingAddress & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( QuantityToWrite & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( QuantityToWrite & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( QuantityToWrite & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( QuantityToWrite & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( WriteByteCount & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( WriteByteCount & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        for( int i = 0; i < WriteByteCount / 2; i++ )
        {
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0xF000 ) >> 12 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0x0F00 ) >> 8 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0xF0 ) >> 4 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( Values[ i ] & 0xF ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        }

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}